

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O1

void __thiscall Centaurus::DFA<wchar_t>::print(DFA<wchar_t> *this,wostream *os,wstring *graph_name)

{
  long *plVar1;
  wostream *pwVar2;
  ulong uVar3;
  pointer pDVar4;
  long lVar5;
  wchar_t *pwVar6;
  wchar_t wVar7;
  ulong uVar8;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"digraph ",8);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(graph_name->_M_dataplus)._M_p,graph_name->_M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" {",2);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"rankdir=\"LR\";",0xd);
    plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      wVar7 = (wchar_t)os;
      std::wostream::put(wVar7);
      std::wostream::flush();
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];",0x2a);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put(wVar7);
        std::wostream::flush();
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (os,L"node [ style=\"solid,filled\" ];",0x1e);
        plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(wVar7);
          std::wostream::flush();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (os,L"edge [ style=\"solid\" ];",0x17);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x50))(plVar1,10);
            std::wostream::put(wVar7);
            std::wostream::flush();
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                      (os,L"SS [ style=\"invisible\" ];",0x19);
            plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 0x50))(plVar1,10);
              std::wostream::put(wVar7);
              std::wostream::flush();
              if ((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                  super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                  super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar8 = 0;
                do {
                  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"S",1);
                  pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)os);
                  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" [ label=\"",10)
                  ;
                  (*(this->super_NFABase<Centaurus::DFAState<wchar_t>_>)._vptr_NFABase[2])
                            (this,os,uVar8);
                  if ((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                      super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].m_accept == true) {
                    lVar5 = 0x15;
                    pwVar6 = L"\", shape=doublecircle";
                  }
                  else {
                    lVar5 = 0xf;
                    pwVar6 = L"\", shape=circle";
                  }
                  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,pwVar6,lVar5);
                  if ((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                      super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].m_long == true) {
                    lVar5 = 0xf;
                    pwVar6 = L", penwidth=2 ];";
                  }
                  else {
                    lVar5 = 3;
                    pwVar6 = L" ];";
                  }
                  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,pwVar6,lVar5);
                  plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
                  if (plVar1 == (long *)0x0) goto LAB_00139e2f;
                  (**(code **)(*plVar1 + 0x50))(plVar1,10);
                  std::wostream::put(wVar7);
                  std::wostream::flush();
                  uVar8 = (ulong)((int)uVar8 + 1);
                  uVar3 = ((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                                 super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                                 super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x71c71c71c71c71c7;
                } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
              }
              std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"SS -> S0;",9);
              plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
              if (plVar1 != (long *)0x0) {
                (**(code **)(*plVar1 + 0x50))(plVar1,10);
                std::wostream::put(wVar7);
                std::wostream::flush();
                pDVar4 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                         super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
                  uVar8 = 0;
                  do {
                    (*pDVar4[uVar8].super_NFABaseState<wchar_t,_Centaurus::IndexVector>.
                      _vptr_NFABaseState[2])(pDVar4 + uVar8,os,uVar8);
                    uVar8 = (ulong)((int)uVar8 + 1);
                    pDVar4 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                             super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar3 = ((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                                   super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 3) *
                            -0x71c71c71c71c71c7;
                  } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
                }
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
                plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
                if (plVar1 != (long *)0x0) {
                  (**(code **)(*plVar1 + 0x50))(plVar1,10);
                  std::wostream::put(wVar7);
                  std::wostream::flush();
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00139e2f:
  std::__throw_bad_cast();
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		os << L"SS [ style=\"invisible\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			if (m_states[i].is_accept_state())
				os << L"\", shape=doublecircle";
			else
				os << L"\", shape=circle";
            if (m_states[i].is_long())
                os << L", penwidth=2 ];" << std::endl;
            else
                os << L" ];" << std::endl;
		}

		os << L"SS -> S0;" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}